

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O0

void __thiscall WorkerContext::operator()(WorkerContext *this)

{
  string_view_t fmt;
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view trace_06;
  string_view trace_07;
  socklen_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Task *this_00;
  sockaddr *__addr;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  void *in_R8;
  socklen_t in_R9D;
  DatabaseSnapshot *in_stack_00000038;
  Task *in_stack_00000040;
  string *in_stack_00000048;
  string s;
  Response response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> address;
  socket_t worker;
  context_t context;
  Response *in_stack_fffffffffffffe88;
  TaskSpec *in_stack_fffffffffffffe90;
  context_t *in_stack_fffffffffffffe98;
  char *pcVar1;
  size_t in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffef4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  socket_t *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  socket_t *in_stack_ffffffffffffff20;
  socket_t *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  Response *in_stack_ffffffffffffff38;
  string local_a0 [64];
  string local_60 [48];
  undefined4 local_30;
  socket_base local_20 [2];
  char local_10 [16];
  
  pcVar1 = local_10;
  zmq::context_t::context_t
            ((context_t *)in_RDI,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             (int)in_stack_fffffffffffffe98);
  zmq::socket_t::socket_t
            ((socket_t *)in_RDI,in_stack_fffffffffffffe98,
             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
  __len = std::__cxx11::string::length();
  zmq::detail::socket_base::setsockopt(local_20,5,(int)args_1,__len,in_R8,in_R9D);
  zmq::detail::socket_base::connect(local_20,0x3211b0,__addr,__len);
  local_30 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
  trace._M_len._4_4_ = in_stack_ffffffffffffff0c;
  trace._M_len._0_4_ = in_stack_ffffffffffffff08;
  trace._M_str = (char *)in_stack_ffffffffffffff10;
  s_send<NetAction>((socket_t *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (NetAction *)in_stack_fffffffffffffef8,trace,in_stack_fffffffffffffef4);
  do {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_06._M_str = (char *)in_stack_ffffffffffffff38;
    trace_06._M_len = (size_t)in_stack_ffffffffffffff30;
    s_recv<std::__cxx11::string>(in_stack_ffffffffffffff28,trace_06);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_05._M_str = in_stack_ffffffffffffff30;
    trace_05._M_len = (size_t)in_stack_ffffffffffffff28;
    s_recv_padding(in_stack_ffffffffffffff20,trace_05);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_07._M_str = (char *)in_stack_ffffffffffffff38;
    trace_07._M_len = (size_t)in_stack_ffffffffffffff30;
    s_recv<std::__cxx11::string>(in_stack_ffffffffffffff28,trace_07);
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_fffffffffffffe90,
               (char *)in_stack_fffffffffffffe88);
    this_00 = std::optional<Task>::operator->((optional<Task> *)0x128907);
    in_stack_fffffffffffffe90 = Task::spec(this_00);
    in_stack_fffffffffffffe88 = (Response *)TaskSpec::id(in_stack_fffffffffffffe90);
    fmt.size_ = in_stack_fffffffffffffeb0;
    fmt.data_ = pcVar1;
    in_stack_ffffffffffffff38 = in_stack_fffffffffffffe88;
    spdlog::info<unsigned_long,std::__cxx11::string>(fmt,&in_RDI->_M_len,args_1);
    std::optional<Task>::operator*((optional<Task> *)0x12896a);
    dispatch_command_safe(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    Response::to_string_abi_cxx11_(in_stack_fffffffffffffe88);
    uVar2 = 1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_00._M_len._4_4_ = in_stack_ffffffffffffff0c;
    trace_00._M_len._0_4_ = in_stack_ffffffffffffff08;
    trace_00._M_str = (char *)in_stack_ffffffffffffff10;
    s_send<NetAction>((socket_t *)CONCAT44(uVar2,in_stack_ffffffffffffff00),
                      (NetAction *)in_stack_fffffffffffffef8,trace_00,in_stack_fffffffffffffef4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_03._M_str = (char *)in_stack_ffffffffffffff20;
    trace_03._M_len = in_stack_ffffffffffffff18;
    s_send_padding(in_stack_ffffffffffffff10,trace_03,in_stack_ffffffffffffff0c);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_01._M_len._4_4_ = in_stack_ffffffffffffff0c;
    trace_01._M_len._0_4_ = in_stack_ffffffffffffff08;
    trace_01._M_str = (char *)in_stack_ffffffffffffff10;
    s_send<std::__cxx11::string>
              ((socket_t *)CONCAT44(uVar2,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8,
               trace_01,in_stack_fffffffffffffef4);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_04._M_str = (char *)in_stack_ffffffffffffff20;
    trace_04._M_len = in_stack_ffffffffffffff18;
    s_send_padding(in_stack_ffffffffffffff10,trace_04,in_stack_ffffffffffffff0c);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)args_1);
    trace_02._M_len._4_4_ = in_stack_ffffffffffffff0c;
    trace_02._M_len._0_4_ = in_stack_ffffffffffffff08;
    trace_02._M_str = (char *)in_stack_ffffffffffffff10;
    s_send<std::__cxx11::string>
              ((socket_t *)CONCAT44(uVar2,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8,
               trace_02,in_stack_fffffffffffffef4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    Response::~Response((Response *)0x128ac6);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_60);
  } while( true );
}

Assistant:

[[noreturn]] void WorkerContext::operator()() {
    zmq::context_t context(1);
    zmq::socket_t worker(context, ZMQ_REQ);

    worker.setsockopt(ZMQ_IDENTITY, identity.c_str(), identity.length());
    worker.connect("ipc://backend.ipc");

    //  Tell backend we're ready for work
    s_send<NetAction>(&worker, NetAction::Ready, ZMQTRACE);

    for (;;) {
        //  Read and save all frames until we get an empty frame
        //  In this example there is only 1 but it could be more
        auto address{s_recv<std::string>(&worker, ZMQTRACE)};

        s_recv_padding(&worker, ZMQTRACE);

        //  Get request, send reply
        auto request{s_recv<std::string>(&worker, ZMQTRACE)};
        spdlog::info("TASK: start [{}]: {}", task->spec().id(), request);

        Response response = dispatch_command_safe(request, &*task, &snap);
        // Note: optionally add funny metadata to response here (like request
        // time, assigned worker, etc)
        std::string s = response.to_string();

        s_send<NetAction>(&worker, NetAction::Response, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, address, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, s, ZMQTRACE);
    }
}